

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  WhereTerm *pWVar1;
  CollSeq *pCVar2;
  char *pcVar3;
  
  if ((iCons < 0) || (pIdxInfo->nConstraint <= iCons)) {
    pcVar3 = (char *)0x0;
  }
  else {
    pWVar1 = termFromWhereClause(*(WhereClause **)(pIdxInfo + 1),
                                 pIdxInfo->aConstraint[(uint)iCons].iTermOffset);
    pcVar3 = "BINARY";
    if (pWVar1->pExpr->pLeft != (Expr *)0x0) {
      pCVar2 = sqlite3ExprCompareCollSeq((Parse *)pIdxInfo[1].aConstraint,pWVar1->pExpr);
      if (pCVar2 != (CollSeq *)0x0) {
        pcVar3 = pCVar2->zName;
      }
    }
  }
  return pcVar3;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = termFromWhereClause(pHidden->pWC, iTerm)->pExpr;
    if( pX->pLeft ){
      pC = sqlite3ExprCompareCollSeq(pHidden->pParse, pX);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}